

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::LocalAccessChainConvertPass::BuildAndAppendVarLoad
          (LocalAccessChainConvertPass *this,Instruction *ptrInst,uint32_t *varId,
          uint32_t *varPteTypeId,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *newInsts)

{
  uint32_t resultId;
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *ptrInst_00;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac [3];
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  resultId = Pass::TakeNextId((Pass *)this);
  if (resultId != 0) {
    uVar1 = Instruction::GetSingleWordInOperand(ptrInst,0);
    *varId = uVar1;
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    ptrInst_00 = analysis::DefUseManager::GetDef(this_00,*varId);
    if (ptrInst_00->opcode_ != OpVariable) {
      __assert_fail("varInst->opcode() == spv::Op::OpVariable",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp"
                    ,0x32,
                    "uint32_t spvtools::opt::LocalAccessChainConvertPass::BuildAndAppendVarLoad(const Instruction *, uint32_t *, uint32_t *, std::vector<std::unique_ptr<Instruction>> *)"
                   );
    }
    uVar1 = Pass::GetPointeeTypeId((Pass *)this,ptrInst_00);
    *varPteTypeId = uVar1;
    local_ac[0] = *varId;
    init_list._M_len = 1;
    init_list._M_array = local_ac;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    local_ac[1] = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,&local_58);
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
               local_ac + 1,&local_78);
    BuildAndAppendInst(this,OpLoad,uVar1,resultId,
                       (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       &local_78,newInsts);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78)
    ;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  return resultId;
}

Assistant:

uint32_t LocalAccessChainConvertPass::BuildAndAppendVarLoad(
    const Instruction* ptrInst, uint32_t* varId, uint32_t* varPteTypeId,
    std::vector<std::unique_ptr<Instruction>>* newInsts) {
  const uint32_t ldResultId = TakeNextId();
  if (ldResultId == 0) {
    return 0;
  }

  *varId = ptrInst->GetSingleWordInOperand(kAccessChainPtrIdInIdx);
  const Instruction* varInst = get_def_use_mgr()->GetDef(*varId);
  assert(varInst->opcode() == spv::Op::OpVariable);
  *varPteTypeId = GetPointeeTypeId(varInst);
  BuildAndAppendInst(spv::Op::OpLoad, *varPteTypeId, ldResultId,
                     {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {*varId}}},
                     newInsts);
  return ldResultId;
}